

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaValidatorPopElem(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaTypeType xVar1;
  xmlSchemaNodeInfoPtr inode;
  xmlSchemaIDCPtr_conflict pxVar2;
  void **ppvVar3;
  long *plVar4;
  xmlSchemaPSVIIDCKeyPtr *ppxVar5;
  long lVar6;
  void *pvVar7;
  xmlSchemaPSVIIDCKeyPtr *ppxVar8;
  xmlSchemaPSVIIDCNodePtr pxVar9;
  xmlDoc *doc;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  xmlRegExecCtxtPtr exec;
  xmlSchemaPSVIIDCBindingPtr_conflict pxVar14;
  xmlSchemaPSVIIDCNodePtr *ppxVar15;
  xmlSchemaItemListPtr pxVar16;
  xmlSchemaTypePtr pxVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  xmlChar *pxVar20;
  xmlNodePtr cur;
  xmlSchemaIDCAugPtr_conflict aidc;
  xmlSchemaIDCAugPtr_conflict pxVar21;
  xmlSchemaContentType xVar22;
  char *pcVar23;
  uint uVar24;
  uint uVar25;
  xmlSchemaIDCMatcherPtr_conflict *ppxVar26;
  xmlSchemaPSVIIDCBindingPtr_conflict pxVar27;
  xmlParserErrors error;
  ulong uVar28;
  long lVar29;
  xmlSchemaValidCtxtPtr pxVar30;
  xmlChar *in_R9;
  int iVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  xmlSchemaPSVIIDCNodePtr pxVar37;
  ulong uVar38;
  ulong uVar39;
  xmlSchemaIDCMatcherPtr_conflict pxVar40;
  xmlSchemaPSVIIDCBindingPtr_conflict pxVar41;
  bool bVar42;
  xmlChar *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  void **local_108;
  xmlSchemaPSVIIDCNodePtr *local_f8;
  xmlHashTablePtr local_f0;
  int terminal;
  int nbval;
  undefined4 uStack_bc;
  xmlSchemaPSVIIDCNodePtr local_b8;
  ulong local_b0;
  xmlSchemaNodeInfoPtr local_a8;
  int nbneg;
  xmlSchemaPSVIIDCBindingPtr_conflict local_98;
  ulong local_90;
  xmlChar *values [10];
  
  inode = vctxt->inode;
  if (vctxt->nbAttrInfos != 0) {
    xmlSchemaClearAttrInfos(vctxt);
  }
  uVar13 = inode->flags;
  if ((uVar13 >> 9 & 1) == 0) {
    pxVar17 = inode->typeDef;
    uVar28 = 0;
    if ((uVar13 >> 10 & 1) == 0 && pxVar17 != (xmlSchemaTypePtr)0x0) {
      xVar22 = pxVar17->contentType;
      uVar28 = 0;
      if (((xVar22 & ~XML_SCHEMA_CONTENT_EMPTY) == XML_SCHEMA_CONTENT_ELEMENTS) &&
         (pxVar17->builtInType != 0x2d)) {
        uVar28 = 0;
        if ((uVar13 >> 8 & 1) != 0) {
LAB_0019d656:
          if (xVar22 == XML_SCHEMA_CONTENT_ELEMENTS) goto LAB_0019c76d;
          goto LAB_0019d65f;
        }
        _nbval = (xmlChar *)CONCAT44(uStack_bc,10);
        exec = inode->regexCtxt;
        if (exec != (xmlRegExecCtxtPtr)0x0) {
LAB_0019c702:
          uVar28 = 0;
          if ((uVar13 & 4) == 0) {
            xmlRegExecNextValues(exec,&nbval,&nbneg,values,&terminal);
            uVar28 = 0;
            iVar11 = xmlRegExecPushString(inode->regexCtxt,(xmlChar *)0x0,(void *)0x0);
            if (iVar11 < 0) {
              uVar13 = inode->flags;
            }
            else if ((iVar11 != 0) || (uVar13 = inode->flags, (uVar13 & 4) != 0)) goto LAB_0019d64f;
            inode->flags = uVar13 | 0x100;
            xmlSchemaComplexTypeErr
                      ((xmlSchemaAbstractCtxtPtr)vctxt,0x1d7ccc,
                       (xmlNodePtr)((ulong)_nbval & 0xffffffff),(xmlSchemaTypePtr)(ulong)(uint)nbneg
                       ,(char *)values,(int)in_R9,(int)in_stack_fffffffffffffed8,
                       (xmlChar **)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            uVar28 = 1;
          }
LAB_0019d64f:
          xVar22 = inode->typeDef->contentType;
          goto LAB_0019d656;
        }
        exec = xmlRegNewExecCtxt(pxVar17->contModel,xmlSchemaVContentModelCallback,vctxt);
        inode->regexCtxt = exec;
        if (exec != (xmlRegExecCtxtPtr)0x0) {
          uVar13 = inode->flags;
          goto LAB_0019c702;
        }
        pcVar23 = "failed to create a regex context";
LAB_0019d79e:
        xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidatorPopElem",pcVar23);
        goto LAB_0019d7a6;
      }
LAB_0019d65f:
      if (vctxt->value != (xmlSchemaValPtr)0x0) {
        xmlSchemaFreeValue(vctxt->value);
        vctxt->value = (xmlSchemaValPtr)0x0;
      }
      if (inode->decl == (xmlSchemaElementPtr)0x0) {
        pxVar17 = inode->typeDef;
        if ((pxVar17->type != XML_SCHEMA_TYPE_SIMPLE) &&
           ((pxVar17->type != XML_SCHEMA_TYPE_BASIC || (pxVar17->builtInType == 0x2d)))) {
          if ((pxVar17->contentType | XML_SCHEMA_CONTENT_ELEMENTS) != XML_SCHEMA_CONTENT_BASIC)
          goto LAB_0019c76d;
          pxVar17 = pxVar17->contentTypeDef;
        }
        uVar13 = xmlSchemaVCheckINodeDataType(vctxt,inode,pxVar17,inode->value);
        uVar28 = (ulong)uVar13;
        bVar42 = (int)uVar13 < 0;
LAB_0019d78a:
        if (bVar42) {
          pcVar23 = "calling xmlSchemaVCheckCVCSimpleType()";
          goto LAB_0019d79e;
        }
      }
      else {
        pxVar20 = inode->decl->value;
        uVar13 = inode->flags;
        if ((uVar13 & 0x24) == 0x20 && pxVar20 != (xmlChar *)0x0) {
          if ((uVar13 & 8) == 0) {
            pxVar17 = inode->typeDef;
            if ((pxVar17->type == XML_SCHEMA_TYPE_SIMPLE) ||
               ((pxVar17->type == XML_SCHEMA_TYPE_BASIC && (pxVar17->builtInType != 0x2d)))) {
LAB_0019d6dd:
              uVar13 = xmlSchemaVCheckINodeDataType(vctxt,inode,pxVar17,pxVar20);
              uVar28 = (ulong)uVar13;
            }
            else if ((pxVar17->contentType | XML_SCHEMA_CONTENT_ELEMENTS) ==
                     XML_SCHEMA_CONTENT_BASIC) {
              pxVar17 = pxVar17->contentTypeDef;
              goto LAB_0019d6dd;
            }
            bVar42 = (int)uVar28 < 0;
            if ((int)uVar28 != 0) goto LAB_0019d78a;
          }
          else {
            pxVar17 = vctxt->inode->typeDef;
            xVar1 = pxVar17->type;
            if (((((xVar1 == XML_SCHEMA_TYPE_COMPLEX) || (pxVar17->builtInType == 0x2d)) &&
                 (xVar22 = pxVar17->contentType, xVar22 != XML_SCHEMA_CONTENT_BASIC)) &&
                (xVar22 != XML_SCHEMA_CONTENT_SIMPLE)) &&
               ((xVar22 != XML_SCHEMA_CONTENT_MIXED ||
                (iVar11 = xmlSchemaIsParticleEmptiable((xmlSchemaParticlePtr)pxVar17->subtypes),
                iVar11 == 0)))) {
              pcVar23 = 
              "For a string to be a valid default, the type definition must be a simple type or a complex type with simple content or mixed content and a particle emptiable"
              ;
              uVar28 = 0xbf3;
              error = XML_SCHEMAP_COS_VALID_DEFAULT_2_1;
LAB_0019d987:
              in_stack_fffffffffffffed8 = (xmlChar *)0x0;
              in_R9 = (xmlChar *)0x0;
              goto LAB_0019d98e;
            }
            if ((xVar1 == XML_SCHEMA_TYPE_SIMPLE) ||
               ((xVar1 == XML_SCHEMA_TYPE_BASIC && (pxVar17->builtInType != 0x2d)))) {
LAB_0019d8fd:
              in_stack_fffffffffffffed8 =
                   (xmlChar *)CONCAT44((int)((ulong)in_stack_fffffffffffffed8 >> 0x20),1);
              in_R9 = (xmlChar *)0x1;
              uVar13 = xmlSchemaVCheckCVCSimpleType
                                 ((xmlSchemaAbstractCtxtPtr)vctxt,(xmlNodePtr)0x0,pxVar17,pxVar20,
                                  &inode->val,1,1,0);
              uVar28 = (ulong)uVar13;
              if ((int)uVar13 < 0) {
                xmlSchemaInternalErr
                          ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaCheckCOSValidDefault",
                           "calling xmlSchemaVCheckCVCSimpleType()");
                pcVar23 = "calling xmlSchemaCheckCOSValidDefault()";
                goto LAB_0019d79e;
              }
              if (uVar13 != 0) goto LAB_0019c76d;
            }
            else if ((pxVar17->contentType | XML_SCHEMA_CONTENT_ELEMENTS) ==
                     XML_SCHEMA_CONTENT_BASIC) {
              pxVar17 = pxVar17->contentTypeDef;
              goto LAB_0019d8fd;
            }
          }
          uVar28 = 0;
          if (((vctxt->options & 1) != 0) && (inode->node != (xmlNodePtr)0x0)) {
            pxVar20 = xmlSchemaNormalizeValue(inode->typeDef,inode->decl->value);
            doc = inode->node->doc;
            if (pxVar20 == (xmlChar *)0x0) {
              cur = xmlNewDocText(doc,inode->decl->value);
            }
            else {
              cur = xmlNewDocText(doc,pxVar20);
              (*xmlFree)(pxVar20);
            }
            if (cur == (xmlNodePtr)0x0) {
              pcVar23 = "calling xmlNewDocText()";
              goto LAB_0019d79e;
            }
            xmlAddChild(inode->node,cur);
          }
        }
        else {
          if ((uVar13 & 4) != 0) goto LAB_0019c76d;
          pxVar17 = inode->typeDef;
          if ((pxVar17->type == XML_SCHEMA_TYPE_SIMPLE) ||
             ((pxVar17->type == XML_SCHEMA_TYPE_BASIC && (pxVar17->builtInType != 0x2d)))) {
LAB_0019d771:
            uVar13 = xmlSchemaVCheckINodeDataType(vctxt,inode,pxVar17,inode->value);
            uVar28 = (ulong)uVar13;
          }
          else if ((pxVar17->contentType | XML_SCHEMA_CONTENT_ELEMENTS) == XML_SCHEMA_CONTENT_BASIC)
          {
            pxVar17 = pxVar17->contentTypeDef;
            goto LAB_0019d771;
          }
          bVar42 = (int)uVar28 < 0;
          if ((int)uVar28 != 0) goto LAB_0019d78a;
          pxVar20 = inode->decl->value;
          uVar28 = 0;
          if ((pxVar20 != (xmlChar *)0x0) && ((inode->decl->flags & 8) != 0)) {
            if ((inode->flags & 0x80) != 0) {
              pcVar23 = 
              "The content must not contain element nodes since there is a fixed value constraint";
              uVar28 = 0x740;
              error = XML_SCHEMAV_CVC_ELT_5_2_2_1;
              goto LAB_0019d987;
            }
            xVar22 = inode->typeDef->contentType;
            if ((xVar22 == XML_SCHEMA_CONTENT_BASIC) || (xVar22 == XML_SCHEMA_CONTENT_SIMPLE)) {
              iVar11 = xmlStrEqual(inode->value,pxVar20);
              if (iVar11 == 0) {
                in_R9 = inode->value;
                in_stack_fffffffffffffed8 = inode->decl->value;
                pcVar23 = "The actual value \'%s\' does not match the fixed value constraint \'%s\'"
                ;
                uVar28 = 0x742;
                error = XML_SCHEMAV_CVC_ELT_5_2_2_2_2;
                goto LAB_0019d98e;
              }
            }
            else if ((xVar22 == XML_SCHEMA_CONTENT_MIXED) &&
                    (iVar11 = xmlStrEqual(inode->value,pxVar20), iVar11 == 0)) {
              in_R9 = inode->value;
              in_stack_fffffffffffffed8 = inode->decl->value;
              pcVar23 = "The initial value \'%s\' does not match the fixed value constraint \'%s\'";
              uVar28 = 0x741;
              error = XML_SCHEMAV_CVC_ELT_5_2_2_2_1;
LAB_0019d98e:
              xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,error,(xmlNodePtr)0x0,
                                 (xmlSchemaBasicItemPtr)0x0,pcVar23,in_R9,in_stack_fffffffffffffed8)
              ;
            }
          }
        }
      }
    }
  }
  else {
    vctxt->skipDepth = vctxt->depth + -1;
    uVar28 = 0;
  }
LAB_0019c76d:
  iVar11 = vctxt->depth;
  if (-1 < iVar11) {
    if (iVar11 == vctxt->skipDepth) {
      vctxt->skipDepth = -1;
    }
    local_a8 = inode;
    local_90 = uVar28;
    if ((inode->appliedXPath != 0) &&
       (iVar11 = xmlSchemaXPathProcessHistory(vctxt,iVar11), iVar11 == -1)) {
LAB_0019d7a6:
      vctxt->err = -1;
      return -1;
    }
    pxVar40 = local_a8->idcMatchers;
    if ((pxVar40 != (xmlSchemaIDCMatcherPtr_conflict)0x0) &&
       ((vctxt->hasKeyrefs != 0 || (vctxt->createIDCNodeTables != 0)))) {
      for (; pxVar40 != (xmlSchemaIDCMatcherPtr_conflict)0x0; pxVar40 = pxVar40->next) {
        pxVar2 = pxVar40->aidc->def;
        if ((((pxVar2->type != XML_SCHEMA_TYPE_IDC_KEYREF) &&
             (pxVar40->targets != (xmlSchemaItemListPtr)0x0)) && (pxVar40->targets->nbItems != 0))
           && ((vctxt->createIDCNodeTables != 0 ||
               ((iVar11 = pxVar40->aidc->keyrefDepth, iVar11 != -1 && (iVar11 <= vctxt->depth))))))
        {
          pxVar41 = vctxt->elemInfos[pxVar40->depth]->idcTable;
          if (pxVar41 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
            pxVar27 = (xmlSchemaPSVIIDCBindingPtr_conflict)
                      &vctxt->elemInfos[pxVar40->depth]->idcTable;
          }
          else {
            do {
              pxVar14 = pxVar41;
              if (pxVar14->definition == pxVar2) goto LAB_0019c889;
              pxVar41 = pxVar14->next;
              pxVar27 = pxVar14;
            } while (pxVar14->next != (xmlSchemaPSVIIDCBindingPtr)0x0);
          }
          pxVar14 = xmlSchemaIDCNewBinding(pxVar2);
          pxVar27->next = pxVar14;
          if (pxVar14 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) goto LAB_0019d7a6;
LAB_0019c889:
          pxVar16 = pxVar14->dupls;
          if ((pxVar16 == (xmlSchemaItemListPtr)0x0) || (iVar11 = pxVar16->nbItems, iVar11 == 0)) {
            iVar11 = 0;
            local_108 = (void **)0x0;
          }
          else {
            local_108 = pxVar16->items;
          }
          if (pxVar14->nodeTable == (xmlSchemaPSVIIDCNodePtr *)0x0) {
            if (iVar11 != 0) {
              bVar42 = false;
              goto LAB_0019c8e7;
            }
          }
          else {
            bVar42 = iVar11 == 0;
            if (pxVar14->nbNodes != 0 || iVar11 != 0) {
LAB_0019c8e7:
              local_b0 = (ulong)pxVar40->targets->nbItems;
              ppvVar3 = pxVar40->targets->items;
              uVar13 = pxVar40->aidc->def->nbFields;
              uVar28 = 0;
              if (0 < (int)uVar13) {
                uVar28 = (ulong)uVar13;
              }
              lVar29 = 0;
              do {
                plVar4 = *(long **)((long)ppvVar3[lVar29] + 8);
                if (!bVar42) {
                  lVar36 = 0;
                  do {
                    if (uVar13 == 1) {
                      iVar12 = xmlSchemaAreValuesEqual
                                         (*(xmlSchemaValPtr *)(*plVar4 + 8),
                                          *(xmlSchemaValPtr *)
                                           (**(long **)((long)local_108[lVar36] + 8) + 8));
                      if (iVar12 == -1) goto LAB_0019d7a6;
                      if (iVar12 == 1) goto LAB_0019cb6c;
                    }
                    else {
                      lVar6 = *(long *)((long)local_108[lVar36] + 8);
                      bVar10 = false;
                      for (uVar35 = 0; uVar28 != uVar35; uVar35 = uVar35 + 1) {
                        iVar12 = xmlSchemaAreValuesEqual
                                           (*(xmlSchemaValPtr *)(plVar4[uVar35] + 8),
                                            *(xmlSchemaValPtr *)(*(long *)(lVar6 + uVar35 * 8) + 8))
                        ;
                        if (iVar12 == -1) goto LAB_0019d7a6;
                        if (iVar12 == 0) goto LAB_0019ca52;
                        bVar10 = true;
                      }
                      if (bVar10) goto LAB_0019cb6c;
                    }
LAB_0019ca52:
                    lVar36 = lVar36 + 1;
                  } while (lVar36 < iVar11);
                }
                if (pxVar14->nbNodes == 0) {
                  iVar12 = 0;
                }
                else {
                  uVar35 = 0;
                  do {
                    if (uVar13 == 1) {
                      iVar12 = xmlSchemaAreValuesEqual
                                         (*(xmlSchemaValPtr *)(*plVar4 + 8),
                                          (*pxVar14->nodeTable[uVar35]->keys)->val);
                      if (iVar12 != 0) {
                        if (iVar12 == -1) goto LAB_0019d7a6;
LAB_0019cb03:
                        pxVar16 = pxVar14->dupls;
                        if (pxVar16 == (xmlSchemaItemListPtr)0x0) {
                          pxVar16 = xmlSchemaItemListCreate();
                          pxVar14->dupls = pxVar16;
                          if (pxVar16 == (xmlSchemaItemListPtr)0x0) goto LAB_0019d7a6;
                        }
                        iVar12 = xmlSchemaItemListAdd
                                           (pxVar16,pxVar14->nodeTable[uVar35 & 0xffffffff]);
                        if (iVar12 == -1) goto LAB_0019d7a6;
                        local_108 = pxVar14->dupls->items;
                        iVar12 = pxVar14->nbNodes;
                        pxVar14->nodeTable[uVar35 & 0xffffffff] =
                             pxVar14->nodeTable[(long)iVar12 + -1];
                        pxVar14->nbNodes = iVar12 + -1;
                        goto LAB_0019cb6c;
                      }
                    }
                    else {
                      ppxVar5 = pxVar14->nodeTable[uVar35]->keys;
                      uVar38 = 0;
                      while( true ) {
                        if (uVar28 == uVar38) goto LAB_0019cb03;
                        iVar12 = xmlSchemaAreValuesEqual
                                           (*(xmlSchemaValPtr *)(plVar4[uVar38] + 8),
                                            ppxVar5[uVar38]->val);
                        if (iVar12 == -1) goto LAB_0019d7a6;
                        if (iVar12 == 0) break;
                        uVar38 = uVar38 + 1;
                      }
                    }
                    uVar35 = uVar35 + 1;
                    iVar12 = pxVar14->nbNodes;
                  } while ((long)uVar35 < (long)iVar12);
                }
                pxVar37 = (xmlSchemaPSVIIDCNodePtr)ppvVar3[lVar29];
                uVar32 = pxVar14->sizeNodes;
                if ((int)uVar32 <= iVar12) {
                  uVar25 = 10;
                  if ((int)uVar32 < 1) {
LAB_0019cac0:
                    ppxVar15 = (xmlSchemaPSVIIDCNodePtr *)
                               (*xmlRealloc)(pxVar14->nodeTable,(ulong)uVar25 << 3);
                    if (ppxVar15 != (xmlSchemaPSVIIDCNodePtr *)0x0) {
                      pxVar14->nodeTable = ppxVar15;
                      pxVar14->sizeNodes = uVar25;
                      iVar12 = pxVar14->nbNodes;
                      goto LAB_0019caeb;
                    }
                  }
                  else if (uVar32 < 1000000000) {
                    uVar24 = uVar32 + 1 >> 1;
                    uVar25 = uVar24 + uVar32;
                    if (1000000000 - uVar24 < uVar32) {
                      uVar25 = 1000000000;
                    }
                    goto LAB_0019cac0;
                  }
                  pxVar30 = (xmlSchemaValidCtxtPtr)0x0;
                  goto LAB_0019da30;
                }
                ppxVar15 = pxVar14->nodeTable;
LAB_0019caeb:
                pxVar14->nbNodes = iVar12 + 1;
                ppxVar15[iVar12] = pxVar37;
LAB_0019cb6c:
                lVar29 = lVar29 + 1;
              } while (lVar29 < (long)local_b0);
              goto LAB_0019cbb4;
            }
            (*xmlFree)(pxVar14->nodeTable);
          }
          pxVar16 = pxVar40->targets;
          pxVar14->nodeTable = (xmlSchemaPSVIIDCNodePtr *)pxVar16->items;
          iVar11 = pxVar16->sizeItems;
          pxVar14->nbNodes = pxVar16->nbItems;
          pxVar14->sizeNodes = iVar11;
          pxVar16->items = (void **)0x0;
          pxVar16->nbItems = 0;
          pxVar16->sizeItems = 0;
          if (pxVar40->htab != (xmlHashTablePtr)0x0) {
            xmlHashFree(pxVar40->htab,xmlFreeIDCHashEntry);
            pxVar40->htab = (xmlHashTablePtr)0x0;
          }
        }
LAB_0019cbb4:
      }
    }
    if (vctxt->inode->hasKeyrefs != 0) {
      ppxVar26 = &vctxt->inode->idcMatchers;
      while (pxVar40 = *ppxVar26, pxVar40 != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
        if (((pxVar40->idcType == 0x18) && (pxVar40->targets != (xmlSchemaItemListPtr)0x0)) &&
           (pxVar40->targets->nbItems != 0)) {
          pxVar2 = pxVar40->aidc->def;
          uVar13 = pxVar2->nbFields;
          pxVar41 = (xmlSchemaPSVIIDCBindingPtr_conflict)&vctxt->inode->idcTable;
          do {
            pxVar41 = pxVar41->next;
            if (pxVar41 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
              bVar42 = false;
              local_f0 = (xmlHashTablePtr)0x0;
              goto LAB_0019cc62;
            }
          } while ((xmlSchemaIDCPtr_conflict)pxVar2->ref->item != pxVar41->definition);
          if (pxVar41->dupls == (xmlSchemaItemListPtr)0x0) {
            bVar42 = false;
          }
          else {
            bVar42 = pxVar41->dupls->nbItems != 0;
          }
          local_f0 = xmlHashCreate(pxVar41->nbNodes * 2);
          for (lVar29 = 0; lVar29 < pxVar41->nbNodes; lVar29 = lVar29 + 1) {
            xmlSchemaHashKeySequence(vctxt,values,pxVar41->nodeTable[lVar29]->keys,uVar13);
            puVar18 = (undefined8 *)(*xmlMalloc)(0x10);
            pxVar20 = values[0];
            if (puVar18 == (undefined8 *)0x0) {
              xmlSchemaVErrMemory(vctxt);
              pxVar20 = values[0];
            }
            else {
              *(int *)(puVar18 + 1) = (int)lVar29;
              puVar19 = (undefined8 *)xmlHashLookup(local_f0,values[0]);
              if (puVar19 == (undefined8 *)0x0) {
                *puVar18 = 0;
                iVar11 = xmlHashAddEntry(local_f0,pxVar20,puVar18);
                if (iVar11 < 0) {
                  xmlSchemaVErrMemory(vctxt);
                  (*xmlFree)(puVar18);
                }
              }
              else {
                *puVar18 = *puVar19;
                *puVar19 = puVar18;
              }
            }
            if (pxVar20 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar20);
            }
          }
LAB_0019cc62:
          uVar28 = 0;
          if (0 < (int)uVar13) {
            uVar28 = (ulong)uVar13;
          }
          for (lVar29 = 0; lVar29 < pxVar40->targets->nbItems; lVar29 = lVar29 + 1) {
            pvVar7 = pxVar40->targets->items[lVar29];
            if (pxVar41 != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
              ppxVar5 = *(xmlSchemaPSVIIDCKeyPtr **)((long)pvVar7 + 8);
              xmlSchemaHashKeySequence(vctxt,values,ppxVar5,uVar13);
              pxVar20 = values[0];
              puVar18 = (undefined8 *)xmlHashLookup(local_f0,values[0]);
              if (pxVar20 != (xmlChar *)0x0) {
                (*xmlFree)(pxVar20);
              }
              for (; puVar18 != (undefined8 *)0x0; puVar18 = (undefined8 *)*puVar18) {
                ppxVar8 = pxVar41->nodeTable[*(int *)(puVar18 + 1)]->keys;
                bVar10 = false;
                for (uVar35 = 0; uVar28 != uVar35; uVar35 = uVar35 + 1) {
                  iVar11 = xmlSchemaAreValuesEqual(ppxVar8[uVar35]->val,ppxVar5[uVar35]->val);
                  if (iVar11 == -1) goto LAB_0019d7a6;
                  if (iVar11 == 0) goto LAB_0019cd38;
                  bVar10 = true;
                }
                if (bVar10) goto LAB_0019ce41;
LAB_0019cd38:
              }
              if (bVar42) {
                for (lVar36 = 0; lVar36 < pxVar41->dupls->nbItems; lVar36 = lVar36 + 1) {
                  lVar6 = *(long *)((long)pxVar41->dupls->items[lVar36] + 8);
                  bVar10 = false;
                  for (uVar35 = 0; uVar28 != uVar35; uVar35 = uVar35 + 1) {
                    iVar11 = xmlSchemaAreValuesEqual
                                       (*(xmlSchemaValPtr *)(*(long *)(lVar6 + uVar35 * 8) + 8),
                                        ppxVar5[uVar35]->val);
                    if (iVar11 == -1) goto LAB_0019d7a6;
                    if (iVar11 == 0) goto LAB_0019cda9;
                    bVar10 = true;
                  }
                  if (bVar10) {
                    _terminal = (xmlChar *)0x0;
                    _nbval = (xmlChar *)0x0;
                    pxVar17 = (xmlSchemaTypePtr)
                              xmlSchemaFormatIDCKeySequence
                                        (vctxt,(xmlChar **)&terminal,
                                         *(xmlSchemaPSVIIDCKeyPtr **)((long)pvVar7 + 8),uVar13);
                    pxVar20 = xmlSchemaGetComponentQName((xmlChar **)&nbval,pxVar40->aidc->def);
                    xmlSchemaKeyrefErr(vctxt,(xmlParserErrors)pvVar7,
                                       (xmlSchemaPSVIIDCNodePtr)
                                       "More than one match found for key-sequence %s of keyref \'%s\'"
                                       ,pxVar17,(char *)pxVar20,in_R9,in_stack_fffffffffffffed8);
                    if (_terminal != (xmlChar *)0x0) {
                      (*xmlFree)(_terminal);
                    }
                    if (_nbval != (xmlChar *)0x0) {
                      (*xmlFree)(_nbval);
                    }
                    goto LAB_0019ce41;
                  }
LAB_0019cda9:
                }
              }
            }
            values[0] = (xmlChar *)0x0;
            _terminal = (xmlChar *)0x0;
            pxVar17 = (xmlSchemaTypePtr)
                      xmlSchemaFormatIDCKeySequence
                                (vctxt,values,*(xmlSchemaPSVIIDCKeyPtr **)((long)pvVar7 + 8),uVar13)
            ;
            pxVar20 = xmlSchemaGetComponentQName((xmlChar **)&terminal,pxVar40->aidc->def);
            xmlSchemaKeyrefErr(vctxt,(xmlParserErrors)pvVar7,
                               (xmlSchemaPSVIIDCNodePtr)
                               "No match found for key-sequence %s of keyref \'%s\'",pxVar17,
                               (char *)pxVar20,in_R9,in_stack_fffffffffffffed8);
            if (values[0] != (xmlChar *)0x0) {
              (*xmlFree)(values[0]);
            }
            if (_terminal != (xmlChar *)0x0) {
              (*xmlFree)(_terminal);
            }
LAB_0019ce41:
          }
          if (local_f0 != (xmlHashTablePtr)0x0) {
            xmlHashFree(local_f0,xmlFreeIDCHashEntry);
          }
        }
        ppxVar26 = &pxVar40->next;
      }
    }
    if ((((local_a8->idcTable != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) &&
         (0 < (long)vctxt->depth)) &&
        ((vctxt->hasKeyrefs != 0 || (vctxt->createIDCNodeTables != 0)))) &&
       (pxVar41 = vctxt->inode->idcTable, pxVar41 != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0)) {
      pxVar27 = (xmlSchemaPSVIIDCBindingPtr_conflict)
                &vctxt->elemInfos[(long)vctxt->depth + -1]->idcTable;
      pxVar37 = (xmlSchemaPSVIIDCNodePtr)0x0;
      iVar11 = 0;
      local_98 = pxVar27;
      for (; pxVar41 != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0; pxVar41 = pxVar41->next) {
        iVar12 = pxVar41->nbNodes;
        if ((iVar12 != 0) ||
           ((pxVar41->dupls != (xmlSchemaItemListPtr)0x0 && (pxVar41->dupls->nbItems != 0)))) {
          if (vctxt->createIDCNodeTables == 0) {
            pxVar21 = vctxt->aidcs;
            do {
              if (pxVar21->def == pxVar41->definition) {
                if ((pxVar21->keyrefDepth == -1) || (vctxt->depth <= pxVar21->keyrefDepth))
                goto LAB_0019d588;
                break;
              }
              pxVar21 = pxVar21->next;
            } while (pxVar21 != (xmlSchemaIDCAugPtr)0x0);
          }
          do {
            pxVar14 = pxVar27->next;
            if (pxVar14 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
              pxVar14 = xmlSchemaIDCNewBinding(pxVar41->definition);
              pxVar27 = local_98;
              if (pxVar14 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) goto LAB_0019d7a6;
              iVar12 = pxVar41->nbNodes;
              if ((long)iVar12 != 0) {
                if (vctxt->psviExposeIDCNodeTables == 0) {
                  pxVar14->nodeTable = pxVar41->nodeTable;
                  pxVar41->nodeTable = (xmlSchemaPSVIIDCNodePtr *)0x0;
                  pxVar14->sizeNodes = pxVar41->sizeNodes;
                  pxVar41->sizeNodes = 0;
                  pxVar14->nbNodes = iVar12;
                  pxVar41->nbNodes = 0;
                }
                else {
                  ppxVar15 = (xmlSchemaPSVIIDCNodePtr *)(*xmlMalloc)((long)iVar12 << 3);
                  pxVar14->nodeTable = ppxVar15;
                  if (ppxVar15 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
                    xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0);
                    xmlSchemaIDCFreeBinding(pxVar14);
                    goto LAB_0019d7a6;
                  }
                  iVar12 = pxVar41->nbNodes;
                  pxVar14->sizeNodes = iVar12;
                  pxVar14->nbNodes = iVar12;
                  memcpy(ppxVar15,pxVar41->nodeTable,(long)iVar12 << 3);
                }
              }
              pxVar16 = pxVar41->dupls;
              if (pxVar16 != (xmlSchemaItemListPtr)0x0) {
                if (pxVar14->dupls != (xmlSchemaItemListPtr)0x0) {
                  xmlSchemaItemListFree(pxVar14->dupls);
                  pxVar16 = pxVar41->dupls;
                }
                pxVar14->dupls = pxVar16;
                pxVar41->dupls = (xmlSchemaItemListPtr)0x0;
              }
              if (pxVar27->next != (xmlSchemaPSVIIDCBindingPtr)0x0) {
                pxVar14->next = pxVar27->next;
              }
              pxVar27->next = pxVar14;
              goto LAB_0019d588;
            }
            pxVar27 = pxVar14;
          } while (pxVar14->definition != pxVar41->definition);
          pxVar16 = pxVar14->dupls;
          if ((pxVar16 == (xmlSchemaItemListPtr)0x0) || (uVar13 = pxVar16->nbItems, uVar13 == 0)) {
            local_f0 = (xmlHashTablePtr)0x0;
            uVar13 = 0;
          }
          else {
            local_f0 = (xmlHashTablePtr)pxVar16->items;
          }
          uVar32 = pxVar14->nbNodes;
          local_f8 = pxVar14->nodeTable;
          uVar25 = pxVar41->definition->nbFields;
          local_b0 = (ulong)(int)uVar13;
          uVar28 = 0;
          if (0 < (int)uVar25) {
            uVar28 = (ulong)uVar25;
          }
          for (lVar29 = 0; pxVar27 = local_98, lVar29 < iVar12; lVar29 = lVar29 + 1) {
            pxVar9 = pxVar41->nodeTable[lVar29];
            if (pxVar9 != (xmlSchemaPSVIIDCNodePtr)0x0) {
              if (uVar13 == 0) {
                if (uVar32 != 0) goto LAB_0019d318;
                uVar32 = 0;
              }
              else {
                uVar35 = 0;
                local_b8 = pxVar37;
                while( true ) {
                  uVar38 = uVar35;
                  iVar12 = iVar11;
                  uVar39 = local_b0;
                  if ((long)local_b0 < (long)uVar35) {
                    uVar39 = uVar35;
                  }
                  while( true ) {
                    if (uVar39 == uVar38) {
                      iVar31 = (int)uVar35;
                      uVar35 = uVar35 & 0xffffffff;
                      pxVar37 = local_b8;
                      iVar11 = iVar12;
                      if (iVar31 <= (int)uVar13) {
                        uVar35 = (ulong)uVar13;
                      }
                      goto LAB_0019d301;
                    }
                    if (uVar25 != 1) break;
                    iVar12 = xmlSchemaAreValuesEqual
                                       ((*pxVar9->keys)->val,
                                        *(xmlSchemaValPtr *)
                                         (**(long **)((long)*(void **)((long)local_f0 + uVar38 * 8)
                                                     + 8) + 8));
                    if (iVar12 != 0) {
                      if (iVar12 == -1) goto LAB_0019d7a6;
                      uVar35 = uVar38;
                      pxVar37 = local_b8;
                      iVar11 = 1;
                      goto LAB_0019d301;
                    }
                    uVar38 = uVar38 + 1;
                    iVar12 = 0;
                  }
                  pxVar37 = *(xmlSchemaPSVIIDCNodePtr *)((long)local_f0 + uVar35 * 8);
                  for (uVar38 = 0; uVar28 != uVar38; uVar38 = uVar38 + 1) {
                    iVar11 = xmlSchemaAreValuesEqual
                                       (pxVar9->keys[uVar38]->val,pxVar37->keys[uVar38]->val);
                    if (iVar11 == -1) goto LAB_0019d7a6;
                    if (iVar11 == 0) {
                      iVar11 = 0;
                      goto LAB_0019d2ac;
                    }
                    iVar11 = 1;
                  }
                  if (iVar11 == 1) break;
LAB_0019d2ac:
                  uVar35 = uVar35 + 1;
                  local_b8 = pxVar37;
                }
                iVar11 = 1;
LAB_0019d301:
                if (((uint)uVar35 == uVar13) && (uVar32 != 0)) {
LAB_0019d318:
                  uVar35 = 0;
                  if (0 < (int)uVar32) {
                    uVar35 = (ulong)uVar32;
                  }
                  for (uVar38 = 0; uVar38 != uVar35; uVar38 = uVar38 + 1) {
                    pxVar37 = local_f8[uVar38];
                    if (uVar25 == 1) {
                      iVar11 = xmlSchemaAreValuesEqual((*pxVar9->keys)->val,(*pxVar37->keys)->val);
                      if (iVar11 != 0) {
                        if (iVar11 == -1) goto LAB_0019d7a6;
LAB_0019d3ef:
                        uVar24 = (uint)uVar38;
                        iVar11 = 1;
                        goto LAB_0019d3f5;
                      }
                    }
                    else {
                      for (uVar39 = 0; uVar28 != uVar39; uVar39 = uVar39 + 1) {
                        iVar11 = xmlSchemaAreValuesEqual
                                           (pxVar9->keys[uVar39]->val,pxVar37->keys[uVar39]->val);
                        if (iVar11 == -1) goto LAB_0019d7a6;
                        if (iVar11 == 0) {
                          iVar11 = 0;
                          goto LAB_0019d3c8;
                        }
                        iVar11 = 1;
                      }
                      if (iVar11 == 1) goto LAB_0019d3ef;
                    }
LAB_0019d3c8:
                  }
                  uVar24 = (uint)uVar35;
LAB_0019d3f5:
                  if (uVar24 == uVar32) {
                    iVar12 = pxVar14->nbNodes;
                    uVar24 = pxVar14->sizeNodes;
                    if (iVar12 < (int)uVar24) {
                      local_f8 = pxVar14->nodeTable;
                    }
                    else {
                      uVar34 = 10;
                      pxVar30 = vctxt;
                      if (0 < (int)uVar24) {
                        if (999999999 < uVar24) goto LAB_0019da30;
                        uVar33 = uVar24 + 1 >> 1;
                        uVar34 = uVar33 + uVar24;
                        if (1000000000 - uVar33 < uVar24) {
                          uVar34 = 1000000000;
                        }
                      }
                      local_f8 = (xmlSchemaPSVIIDCNodePtr *)
                                 (*xmlRealloc)(pxVar14->nodeTable,(ulong)uVar34 << 3);
                      if (local_f8 == (xmlSchemaPSVIIDCNodePtr *)0x0) goto LAB_0019da30;
                      pxVar14->nodeTable = local_f8;
                      pxVar14->sizeNodes = uVar34;
                      iVar12 = pxVar14->nbNodes;
                    }
                    pxVar14->nbNodes = iVar12 + 1;
                    local_f8[iVar12] = pxVar9;
                  }
                  else {
                    uVar34 = pxVar14->nbNodes;
                    pxVar14->nbNodes = uVar34 - 1;
                    local_f8[uVar24] = local_f8[(long)(int)uVar32 + -1];
                    if (uVar34 != uVar32) {
                      local_f8[(long)(int)uVar32 + -1] = local_f8[(long)(int)uVar34 + -1];
                    }
                    pxVar16 = pxVar14->dupls;
                    if (pxVar16 == (xmlSchemaItemListPtr)0x0) {
                      pxVar16 = xmlSchemaItemListCreate();
                      pxVar14->dupls = pxVar16;
                      if (pxVar16 == (xmlSchemaItemListPtr)0x0) goto LAB_0019d7a6;
                    }
                    uVar32 = uVar32 - 1;
                    xmlSchemaItemListAdd(pxVar16,pxVar37);
                    local_f0 = (xmlHashTablePtr)pxVar14->dupls->items;
                  }
                }
              }
            }
            iVar12 = pxVar41->nbNodes;
          }
        }
LAB_0019d588:
      }
    }
    xmlSchemaClearElemInfo(vctxt,local_a8);
    iVar11 = vctxt->depth;
    if ((long)iVar11 != 0) {
      for (pxVar21 = vctxt->aidcs; pxVar21 != (xmlSchemaIDCAugPtr_conflict)0x0;
          pxVar21 = pxVar21->next) {
        if (pxVar21->keyrefDepth == iVar11) {
          pxVar21->keyrefDepth = -1;
        }
      }
      vctxt->depth = iVar11 + -1;
      vctxt->inode = vctxt->elemInfos[(long)iVar11 + -1];
      return (int)local_90;
    }
    vctxt->depth = -1;
    vctxt->inode = (xmlSchemaNodeInfoPtr)0x0;
  }
  return 0;
LAB_0019da30:
  xmlSchemaVErrMemory(pxVar30);
  goto LAB_0019d7a6;
}

Assistant:

static int
xmlSchemaValidatorPopElem(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;
    xmlSchemaNodeInfoPtr inode = vctxt->inode;

    if (vctxt->nbAttrInfos != 0)
	xmlSchemaClearAttrInfos(vctxt);
    if (inode->flags & XML_SCHEMA_NODE_INFO_ERR_NOT_EXPECTED) {
	/*
	* This element was not expected;
	* we will not validate child elements of broken parents.
	* Skip validation of all content of the parent.
	*/
	vctxt->skipDepth = vctxt->depth -1;
	goto end_elem;
    }
    if ((inode->typeDef == NULL) ||
	(inode->flags & XML_SCHEMA_NODE_INFO_ERR_BAD_TYPE)) {
	/*
	* 1. the type definition might be missing if the element was
	*    error prone
	* 2. it might be abstract.
	*/
	goto end_elem;
    }
    /*
    * Check the content model.
    */
    if ((inode->typeDef->contentType == XML_SCHEMA_CONTENT_MIXED) ||
	(inode->typeDef->contentType == XML_SCHEMA_CONTENT_ELEMENTS)) {

	/*
	* Workaround for "anyType".
	*/
	if (inode->typeDef->builtInType == XML_SCHEMAS_ANYTYPE)
	    goto character_content;

	if ((inode->flags & XML_SCHEMA_ELEM_INFO_ERR_BAD_CONTENT) == 0) {
	    xmlChar *values[10];
	    int terminal, nbval = 10, nbneg;

	    if (inode->regexCtxt == NULL) {
		/*
		* Create the regex context.
		*/
		inode->regexCtxt =
		    xmlRegNewExecCtxt(inode->typeDef->contModel,
		    xmlSchemaVContentModelCallback, vctxt);
		if (inode->regexCtxt == NULL) {
		    VERROR_INT("xmlSchemaValidatorPopElem",
			"failed to create a regex context");
		    goto internal_error;
		}
	    }

	    /*
	     * Do not check further content if the node has been nilled
	     */
	    if (INODE_NILLED(inode)) {
		ret = 0;
                goto skip_nilled;
	    }

	    /*
	    * Get hold of the still expected content, since a further
	    * call to xmlRegExecPushString() will lose this information.
	    */
	    xmlRegExecNextValues(inode->regexCtxt,
		&nbval, &nbneg, &values[0], &terminal);
	    ret = xmlRegExecPushString(inode->regexCtxt, NULL, NULL);
	    if ((ret<0) || ((ret==0) && (!INODE_NILLED(inode)))) {
		/*
		* Still missing something.
		*/
		ret = 1;
		inode->flags |=
		    XML_SCHEMA_ELEM_INFO_ERR_BAD_CONTENT;
		xmlSchemaComplexTypeErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_ELEMENT_CONTENT, NULL, NULL,
		    "Missing child element(s)",
		    nbval, nbneg, values);
	    } else {
		/*
		* Content model is satisfied.
		*/
		ret = 0;
	    }

	}
    }

skip_nilled:

    if (inode->typeDef->contentType == XML_SCHEMA_CONTENT_ELEMENTS)
	goto end_elem;

character_content:

    if (vctxt->value != NULL) {
	xmlSchemaFreeValue(vctxt->value);
	vctxt->value = NULL;
    }
    /*
    * Check character content.
    */
    if (inode->decl == NULL) {
	/*
	* Speedup if no declaration exists.
	*/
	if (WXS_IS_SIMPLE(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef, inode->value);
	} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef->contentTypeDef,
		inode->value);
	}
	if (ret < 0) {
	    VERROR_INT("xmlSchemaValidatorPopElem",
		"calling xmlSchemaVCheckCVCSimpleType()");
	    goto internal_error;
	}
	goto end_elem;
    }
    /*
    * cvc-elt (3.3.4) : 5
    * The appropriate case among the following must be true:
    */
    /*
    * cvc-elt (3.3.4) : 5.1
    * If the declaration has a {value constraint},
    * the item has neither element nor character [children] and
    * clause 3.2 has not applied, then all of the following must be true:
    */
    if ((inode->decl->value != NULL) &&
	(inode->flags & XML_SCHEMA_ELEM_INFO_EMPTY) &&
	(! INODE_NILLED(inode))) {
	/*
	* cvc-elt (3.3.4) : 5.1.1
	* If the `actual type definition` is a `local type definition`
	* then the canonical lexical representation of the {value constraint}
	* value must be a valid default for the `actual type definition` as
	* defined in Element Default Valid (Immediate) ($3.3.6).
	*/
	/*
	* NOTE: 'local' above means types acquired by xsi:type.
	* NOTE: Although the *canonical* value is stated, it is not
	* relevant if canonical or not. Additionally XML Schema 1.1
	* will removed this requirement as well.
	*/
	if (inode->flags & XML_SCHEMA_ELEM_INFO_LOCAL_TYPE) {

	    ret = xmlSchemaCheckCOSValidDefault(vctxt,
		inode->decl->value, &(inode->val));
	    if (ret != 0) {
		if (ret < 0) {
		    VERROR_INT("xmlSchemaValidatorPopElem",
			"calling xmlSchemaCheckCOSValidDefault()");
		    goto internal_error;
		}
		goto end_elem;
	    }
	    /*
	    * Stop here, to avoid redundant validation of the value
	    * (see following).
	    */
	    goto default_psvi;
	}
	/*
	* cvc-elt (3.3.4) : 5.1.2
	* The element information item with the canonical lexical
	* representation of the {value constraint} value used as its
	* `normalized value` must be `valid` with respect to the
	* `actual type definition` as defined by Element Locally Valid (Type)
	* ($3.3.4).
	*/
	if (WXS_IS_SIMPLE(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef, inode->decl->value);
	} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef->contentTypeDef,
		inode->decl->value);
	}
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidatorPopElem",
		    "calling xmlSchemaVCheckCVCSimpleType()");
		goto internal_error;
	    }
	    goto end_elem;
	}

default_psvi:
	/*
	* PSVI: Create a text node on the instance element.
	*/
	if ((vctxt->options & XML_SCHEMA_VAL_VC_I_CREATE) &&
	    (inode->node != NULL)) {
	    xmlNodePtr textChild;
	    xmlChar *normValue;
	    /*
	    * VAL TODO: Normalize the value.
	    */
	    normValue = xmlSchemaNormalizeValue(inode->typeDef,
		inode->decl->value);
	    if (normValue != NULL) {
		textChild = xmlNewDocText(inode->node->doc,
                        BAD_CAST normValue);
		xmlFree(normValue);
	    } else
		textChild = xmlNewDocText(inode->node->doc,
                        inode->decl->value);
	    if (textChild == NULL) {
		VERROR_INT("xmlSchemaValidatorPopElem",
		    "calling xmlNewDocText()");
		goto internal_error;
	    } else
		xmlAddChild(inode->node, textChild);
	}

    } else if (! INODE_NILLED(inode)) {
	/*
	* 5.2.1 The element information item must be `valid` with respect
	* to the `actual type definition` as defined by Element Locally
	* Valid (Type) ($3.3.4).
	*/
	if (WXS_IS_SIMPLE(inode->typeDef)) {
	     /*
	    * SPEC (cvc-type) (3.1)
	    * "If the type definition is a simple type definition, ..."
	    * (3.1.3) "If clause 3.2 of Element Locally Valid
	    * (Element) ($3.3.4) did not apply, then the `normalized value`
	    * must be `valid` with respect to the type definition as defined
	    * by String Valid ($3.14.4).
	    */
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		    inode, inode->typeDef, inode->value);
	} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
	    /*
	    * SPEC (cvc-type) (3.2) "If the type definition is a complex type
	    * definition, then the element information item must be
	    * `valid` with respect to the type definition as per
	    * Element Locally Valid (Complex Type) ($3.4.4);"
	    *
	    * SPEC (cvc-complex-type) (2.2)
	    * "If the {content type} is a simple type definition, ...
	    * the `normalized value` of the element information item is
	    * `valid` with respect to that simple type definition as
	    * defined by String Valid ($3.14.4)."
	    */
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef->contentTypeDef, inode->value);
	}
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidatorPopElem",
		    "calling xmlSchemaVCheckCVCSimpleType()");
		goto internal_error;
	    }
	    goto end_elem;
	}
	/*
	* 5.2.2 If there is a fixed {value constraint} and clause 3.2 has
	* not applied, all of the following must be true:
	*/
	if ((inode->decl->value != NULL) &&
	    (inode->decl->flags & XML_SCHEMAS_ELEM_FIXED)) {

	    /*
	    * TODO: We will need a computed value, when comparison is
	    * done on computed values.
	    */
	    /*
	    * 5.2.2.1 The element information item must have no element
	    * information item [children].
	    */
	    if (inode->flags &
		    XML_SCHEMA_ELEM_INFO_HAS_ELEM_CONTENT) {
		ret = XML_SCHEMAV_CVC_ELT_5_2_2_1;
		VERROR(ret, NULL,
		    "The content must not contain element nodes since "
		    "there is a fixed value constraint");
		goto end_elem;
	    } else {
		/*
		* 5.2.2.2 The appropriate case among the following must
		* be true:
		*/
		if (WXS_HAS_MIXED_CONTENT(inode->typeDef)) {
		    /*
		    * 5.2.2.2.1 If the {content type} of the `actual type
		    * definition` is mixed, then the *initial value* of the
		    * item must match the canonical lexical representation
		    * of the {value constraint} value.
		    *
		    * ... the *initial value* of an element information
		    * item is the string composed of, in order, the
		    * [character code] of each character information item in
		    * the [children] of that element information item.
		    */
		    if (! xmlStrEqual(inode->value, inode->decl->value)){
			/*
			* VAL TODO: Report invalid & expected values as well.
			* VAL TODO: Implement the canonical stuff.
			*/
			ret = XML_SCHEMAV_CVC_ELT_5_2_2_2_1;
			xmlSchemaCustomErr(ACTXT_CAST vctxt,
			    ret, NULL, NULL,
			    "The initial value '%s' does not match the fixed "
			    "value constraint '%s'",
			    inode->value, inode->decl->value);
			goto end_elem;
		    }
		} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
		    /*
		    * 5.2.2.2.2 If the {content type} of the `actual type
		    * definition` is a simple type definition, then the
		    * *actual value* of the item must match the canonical
		    * lexical representation of the {value constraint} value.
		    */
		    /*
		    * VAL TODO: *actual value* is the normalized value, impl.
		    *           this.
		    * VAL TODO: Report invalid & expected values as well.
		    * VAL TODO: Implement a comparison with the computed values.
		    */
		    if (! xmlStrEqual(inode->value,
			    inode->decl->value)) {
			ret = XML_SCHEMAV_CVC_ELT_5_2_2_2_2;
			xmlSchemaCustomErr(ACTXT_CAST vctxt,
			    ret, NULL, NULL,
			    "The actual value '%s' does not match the fixed "
			    "value constraint '%s'",
			    inode->value,
			    inode->decl->value);
			goto end_elem;
		    }
		}
	    }
	}
    }

end_elem:
    if (vctxt->depth < 0) {
	/* TODO: raise error? */
	return (0);
    }
    if (vctxt->depth == vctxt->skipDepth)
	vctxt->skipDepth = -1;
    /*
    * Evaluate the history of XPath state objects.
    */
    if (inode->appliedXPath &&
	(xmlSchemaXPathProcessHistory(vctxt, vctxt->depth) == -1))
	goto internal_error;
    /*
    * MAYBE TODO:
    * SPEC (6) "The element information item must be `valid` with
    * respect to each of the {identity-constraint definitions} as per
    * Identity-constraint Satisfied ($3.11.4)."
    */
    /*
    * PSVI TODO: If we expose IDC node-tables via PSVI then the tables
    *   need to be built in any case.
    *   We will currently build IDC node-tables and bubble them only if
    *   keyrefs do exist.
    */

    /*
    * Add the current IDC target-nodes to the IDC node-tables.
    */
    if ((inode->idcMatchers != NULL) &&
	(vctxt->hasKeyrefs || vctxt->createIDCNodeTables))
    {
	if (xmlSchemaIDCFillNodeTables(vctxt, inode) == -1)
	    goto internal_error;
    }
    /*
    * Validate IDC keyrefs.
    */
    if (vctxt->inode->hasKeyrefs)
	if (xmlSchemaCheckCVCIDCKeyRef(vctxt) == -1)
	    goto internal_error;
    /*
    * Merge/free the IDC table.
    */
    if (inode->idcTable != NULL) {
	if ((vctxt->depth > 0) &&
	    (vctxt->hasKeyrefs || vctxt->createIDCNodeTables))
	{
	    /*
	    * Merge the IDC node table with the table of the parent node.
	    */
	    if (xmlSchemaBubbleIDCNodeTables(vctxt) == -1)
		goto internal_error;
	}
    }
    /*
    * Clear the current ielem.
    * VAL TODO: Don't free the PSVI IDC tables if they are
    * requested for the PSVI.
    */
    xmlSchemaClearElemInfo(vctxt, inode);
    /*
    * Skip further processing if we are on the validation root.
    */
    if (vctxt->depth == 0) {
	vctxt->depth--;
	vctxt->inode = NULL;
	return (0);
    }
    /*
    * Reset the keyrefDepth if needed.
    */
    if (vctxt->aidcs != NULL) {
	xmlSchemaIDCAugPtr aidc = vctxt->aidcs;
	do {
	    if (aidc->keyrefDepth == vctxt->depth) {
		/*
		* A 'keyrefDepth' of a key/unique IDC matches the current
		* depth, this means that we are leaving the scope of the
		* top-most keyref IDC which refers to this IDC.
		*/
		aidc->keyrefDepth = -1;
	    }
	    aidc = aidc->next;
	} while (aidc != NULL);
    }
    vctxt->depth--;
    vctxt->inode = vctxt->elemInfos[vctxt->depth];
    /*
    * VAL TODO: 7 If the element information item is the `validation root`, it must be
    * `valid` per Validation Root Valid (ID/IDREF) ($3.3.4).
    */
    return (ret);

internal_error:
    vctxt->err = -1;
    return (-1);
}